

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O3

int pkcs12_pbe_encrypt_init
              (CBB *out,EVP_CIPHER_CTX *ctx,int alg_nid,EVP_CIPHER *alg_cipher,uint32_t iterations,
              char *pass,size_t pass_len,uint8_t *salt,size_t salt_len)

{
  int iVar1;
  long lVar2;
  pbe_suite *suite;
  CBB param;
  CBB algorithm;
  
  if (alg_nid == -1) {
    iVar1 = PKCS5_pbe2_encrypt_init(out,ctx,alg_cipher,iterations,pass,pass_len,salt,salt_len);
  }
  else {
    lVar2 = 4;
    suite = kBuiltinPBE;
    do {
      if (((suite->pbe_nid == alg_nid) && (suite->cipher_func != (_func_EVP_CIPHER_ptr *)0x0)) &&
         (suite->md_func != (_func_EVP_MD_ptr *)0x0)) {
        iVar1 = CBB_add_asn1(out,&algorithm,0x20000010);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = CBB_add_asn1_element(&algorithm,6,suite->oid,(ulong)suite->oid_len);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = CBB_add_asn1(&algorithm,&param,0x20000010);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = CBB_add_asn1_octet_string(&param,salt,salt_len);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = CBB_add_asn1_uint64(&param,(ulong)iterations);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = CBB_flush(out);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = pkcs12_pbe_cipher_init(suite,ctx,iterations,pass,pass_len,salt,salt_len,1);
        return iVar1;
      }
      suite = suite + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    iVar1 = 0;
    ERR_put_error(0x13,0,0x77,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,300);
  }
  return iVar1;
}

Assistant:

int pkcs12_pbe_encrypt_init(CBB *out, EVP_CIPHER_CTX *ctx, int alg_nid,
                            const EVP_CIPHER *alg_cipher, uint32_t iterations,
                            const char *pass, size_t pass_len,
                            const uint8_t *salt, size_t salt_len) {
  // TODO(davidben): OpenSSL has since extended |pbe_nid| to control either
  // the PBES1 scheme or the PBES2 PRF. E.g. passing |NID_hmacWithSHA256| will
  // select PBES2 with HMAC-SHA256 as the PRF. Implement this if anything uses
  // it. See 5693a30813a031d3921a016a870420e7eb93ec90 in OpenSSL.
  if (alg_nid == -1) {
    return PKCS5_pbe2_encrypt_init(out, ctx, alg_cipher, iterations, pass,
                                   pass_len, salt, salt_len);
  }

  const struct pbe_suite *suite = get_pkcs12_pbe_suite(alg_nid);
  if (suite == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNKNOWN_ALGORITHM);
    return 0;
  }

  // See RFC 2898, appendix A.3.
  CBB algorithm, param;
  if (!CBB_add_asn1(out, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, suite->oid,
                            suite->oid_len) ||
      !CBB_add_asn1(&algorithm, &param, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_octet_string(&param, salt, salt_len) ||
      !CBB_add_asn1_uint64(&param, iterations) || !CBB_flush(out)) {
    return 0;
  }

  return pkcs12_pbe_cipher_init(suite, ctx, iterations, pass, pass_len, salt,
                                salt_len, 1 /* encrypt */);
}